

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleMessageBox::text(QString *__return_storage_ptr__,QAccessibleMessageBox *this,Text t)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QWidget *pQVar4;
  QTypedArrayData<char16_t> *tmp;
  char16_t *tmp_1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t == Help) {
    pQVar4 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QMessageBox::informativeText((QString *)&local_58,(QMessageBox *)pQVar4);
LAB_004d8f9a:
    pDVar1 = local_58.d;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
LAB_004d8faa:
    (__return_storage_ptr__->d).size = local_58.size;
  }
  else {
    if (t == Value) {
      pQVar4 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
      QMessageBox::text((QString *)&local_58,(QMessageBox *)pQVar4);
      goto LAB_004d8f9a;
    }
    if (t == Name) {
      QAccessibleWidget::text((QString *)&local_58,&this->super_QAccessibleWidget,Name);
      qVar3 = local_58.size;
      pcVar2 = local_58.ptr;
      pDVar1 = local_58.d;
      local_58.d = (Data *)0x0;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      local_58.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = local_58.size;
      local_58.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (qVar3 != 0) goto LAB_004d8fe9;
      pQVar4 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
      QMessageBox::text((QString *)&local_58,(QMessageBox *)pQVar4);
      (__return_storage_ptr__->d).d = local_58.d;
      (__return_storage_ptr__->d).ptr = local_58.ptr;
      local_58.d = pDVar1;
      local_58.ptr = pcVar2;
      goto LAB_004d8faa;
    }
    QAccessibleWidget::text((QString *)&local_58,&this->super_QAccessibleWidget,t);
    pDVar1 = local_58.d;
    local_58.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_58.size;
  }
  local_58.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_004d8fe9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMessageBox::text(QAccessible::Text t) const
{
    QString str;

    switch (t) {
    case QAccessible::Name:
        str = QAccessibleWidget::text(t);
        if (str.isEmpty()) // implies no title text is set
            str = messageBox()->text();
        break;
    case QAccessible::Value:
        str = messageBox()->text();
        break;
    case QAccessible::Help:
        str = messageBox()->informativeText();
        break;
    default:
        str = QAccessibleWidget::text(t);
        break;
    }

    return str;
}